

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O3

int __thiscall
curlpp::CallbackException<curlpp::UnknowException>::clone
          (CallbackException<curlpp::UnknowException> *this,__fn *__fn,void *__child_stack,
          int __flags,void *__arg,...)

{
  CallbackExceptionBase *this_00;
  
  this_00 = (CallbackExceptionBase *)operator_new(0x20);
  CallbackExceptionBase::CallbackExceptionBase(this_00,&this->super_CallbackExceptionBase);
  *(undefined ***)&this_00->super_RuntimeError = &PTR__CallbackException_00133ce0;
  std::runtime_error::runtime_error
            ((runtime_error *)(this_00 + 1),(runtime_error *)&this->mException);
  *(undefined ***)&this_00[1].super_RuntimeError = &PTR__RuntimeError_00133a40;
  return (int)this_00;
}

Assistant:

virtual _CE * clone() 
		{
			return new _CE(*this);
		}